

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repo_error.cpp
# Opt level: O0

string * __thiscall
pstore::repo::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  char *pcVar1;
  allocator local_29;
  char *local_28;
  char *result;
  error_category *peStack_18;
  int error_local;
  error_category *this_local;
  
  local_28 = "unknown error";
  switch(error) {
  case 1:
    local_28 = "bad fragment record";
    break;
  case 2:
    local_28 = "bad fragment type";
    break;
  case 3:
    local_28 = "bad compilation record";
    break;
  case 4:
    local_28 = "too many members in a compilation";
    break;
  case 5:
    local_28 = "bss section too large";
  }
  pcVar1 = local_28;
  result._4_4_ = error;
  peStack_18 = this;
  this_local = (error_category *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message (int const error) const {
            auto * result = "unknown error";
            switch (static_cast<error_code> (error)) {
            case error_code::bad_fragment_record: result = "bad fragment record"; break;
            case error_code::bad_fragment_type: result = "bad fragment type"; break;
            case error_code::bad_compilation_record: result = "bad compilation record"; break;
            case error_code::too_many_members_in_compilation:
                result = "too many members in a compilation";
                break;
            case error_code::bss_section_too_large: result = "bss section too large"; break;
            }
            return result;
        }